

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::Module::removeMemories(Module *this,function<bool_(wasm::Memory_*)> *pred)

{
  function<bool_(wasm::Memory_*)> local_38;
  function<bool_(wasm::Memory_*)> *local_18;
  function<bool_(wasm::Memory_*)> *pred_local;
  Module *this_local;
  
  local_18 = pred;
  pred_local = (function<bool_(wasm::Memory_*)> *)this;
  std::function<bool_(wasm::Memory_*)>::function(&local_38,pred);
  removeModuleElements<std::vector<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>,std::allocator<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>>>,std::unordered_map<wasm::Name,wasm::Memory*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Memory*>>>,wasm::Memory>
            (&this->memories,&this->memoriesMap,&local_38);
  std::function<bool_(wasm::Memory_*)>::~function(&local_38);
  return;
}

Assistant:

void Module::removeMemories(std::function<bool(Memory*)> pred) {
  removeModuleElements(memories, memoriesMap, pred);
}